

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O2

void __thiscall
ConfidentialValue_Constractor_bytedata8_Test::~ConfidentialValue_Constractor_bytedata8_Test
          (ConfidentialValue_Constractor_bytedata8_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_bytedata8) {
  // 8byte
  ConfidentialValue value(ByteData("0000000005f5e100"));
  EXPECT_STREQ(value.GetHex().c_str(), "010000000005f5e100");
  EXPECT_EQ(value.GetData().GetDataSize(), 9);
  EXPECT_EQ(value.HasBlinding(), false);
  EXPECT_EQ(value.GetAmount().GetSatoshiValue(), 100000000);
}